

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O2

If_Box_t * If_LibBoxFindBox(If_LibBox_t *p,char *pName)

{
  int iVar1;
  If_Box_t *pIVar2;
  int i;
  
  if (p != (If_LibBox_t *)0x0) {
    for (i = 0; i < p->vBoxes->nSize; i = i + 1) {
      pIVar2 = (If_Box_t *)Vec_PtrEntry(p->vBoxes,i);
      if ((pIVar2 != (If_Box_t *)0x0) && (iVar1 = strcmp(pIVar2->pName,pName), iVar1 == 0)) {
        return pIVar2;
      }
    }
  }
  return (If_Box_t *)0x0;
}

Assistant:

If_Box_t * If_LibBoxFindBox( If_LibBox_t * p, char * pName )
{
    If_Box_t * pBox;
    int i;
    if ( p == NULL )
        return NULL;
    If_LibBoxForEachBox( p, pBox, i )
        if ( !strcmp(pBox->pName, pName) )
            return pBox;
    return NULL;
}